

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

int Abc_SclComputeParametersPin(SC_Lib *p,SC_Cell *pCell,int iPin,float Slew,float *pLD,float *pPD)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  SC_Timing *pTime;
  Vec_Flt_t *pVVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  SC_Pair ArrIn;
  SC_Pair SlewOut;
  SC_Pair local_90;
  SC_Pair local_88;
  SC_Pair SlewIn;
  SC_Pair local_68;
  SC_Pair local_60;
  SC_Pair Load2;
  SC_Pair Load1;
  
  ArrIn.rise = 0.0;
  ArrIn.fall = 0.0;
  local_88.rise = 0.0;
  local_88.fall = 0.0;
  local_90.rise = 0.0;
  local_90.fall = 0.0;
  local_68.rise = 0.0;
  local_68.fall = 0.0;
  SlewOut.rise = 0.0;
  SlewOut.fall = 0.0;
  SlewIn.rise = Slew;
  SlewIn.fall = Slew;
  pTime = Scl_CellPinTime(pCell,iPin);
  if (pTime == (SC_Timing *)0x0) {
    iVar5 = 0;
  }
  else {
    if ((pTime->pCellRise).vIndex1.nSize == 1) {
      *pLD = 0.0;
      pVVar6 = (Vec_Flt_t *)Vec_PtrEntry(&(pTime->pCellRise).vData,0);
      fVar7 = Vec_FltEntry(pVVar6,0);
    }
    else {
      pVVar6 = &(pTime->pCellRise).vIndex1;
      local_60.rise = 0.0;
      local_60.fall = 0.0;
      fVar8 = Vec_FltEntry(pVVar6,0);
      Load1.rise = fVar8;
      Load1.fall = fVar8;
      fVar9 = Vec_FltEntry(pVVar6,(pTime->pCellRise).vIndex1.nSize + -2);
      Load2.rise = fVar9;
      Load2.fall = fVar9;
      Scl_LibPinArrival(pTime,&ArrIn,&SlewIn,&local_60,&local_88,&SlewOut);
      Scl_LibPinArrival(pTime,&ArrIn,&SlewIn,&Load1,&local_90,&SlewOut);
      Scl_LibPinArrival(pTime,&ArrIn,&SlewIn,&Load2,&local_68,&SlewOut);
      fVar7 = local_88.rise * 0.5 + local_88.fall * 0.5;
      fVar2 = local_68.fall * 0.5;
      fVar4 = local_90.fall * 0.5;
      fVar1 = local_68.rise * 0.5;
      fVar3 = local_90.rise * 0.5;
      fVar10 = SC_CellPinCap(pCell,iPin);
      *pLD = ((fVar1 + fVar2) - (fVar3 + fVar4)) / ((fVar9 - fVar8) / fVar10);
    }
    *pPD = fVar7;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int Abc_SclComputeParametersPin( SC_Lib * p, SC_Cell * pCell, int iPin, float Slew, float * pLD, float * pPD )
{
    SC_Pair Load0, Load1, Load2;
    SC_Pair ArrIn  = { 0.0, 0.0 };
    SC_Pair SlewIn = { Slew, Slew };
    SC_Pair ArrOut0 = { 0.0, 0.0 };
    SC_Pair ArrOut1 = { 0.0, 0.0 };
    SC_Pair ArrOut2 = { 0.0, 0.0 };
    SC_Pair SlewOut = { 0.0, 0.0 };
    SC_Timing * pTime = Scl_CellPinTime( pCell, iPin );
    Vec_Flt_t * vIndex = pTime ? &pTime->pCellRise.vIndex1 : NULL; // capacitance
    if ( vIndex == NULL )
        return 0;
    // handle constant table
    if ( Vec_FltSize(vIndex) == 1 )
    {
        *pLD = 0;
        *pPD = Vec_FltEntry( (Vec_Flt_t *)Vec_PtrEntry(&pTime->pCellRise.vData, 0), 0 );
        return 1;
    }
    // get load points
    Load0.rise = Load0.fall = 0.0;
    Load1.rise = Load1.fall = Vec_FltEntry( vIndex, 0 );
    Load2.rise = Load2.fall = Vec_FltEntry( vIndex, Vec_FltSize(vIndex) - 2 );
    // compute delay
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load0, &ArrOut0, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load1, &ArrOut1, &SlewOut );
    Scl_LibPinArrival( pTime, &ArrIn, &SlewIn, &Load2, &ArrOut2, &SlewOut );
    ArrOut0.rise = 0.5 * ArrOut0.rise + 0.5 * ArrOut0.fall;
    ArrOut1.rise = 0.5 * ArrOut1.rise + 0.5 * ArrOut1.fall;
    ArrOut2.rise = 0.5 * ArrOut2.rise + 0.5 * ArrOut2.fall;
    // get tangent
    *pLD = (ArrOut2.rise - ArrOut1.rise) / ((Load2.rise - Load1.rise) / SC_CellPinCap(pCell, iPin));
    // get constant
    *pPD = ArrOut0.rise;
    return 1;
}